

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainAI.cpp
# Opt level: O3

void __thiscall tiger::trains::ai::TrainAI::makePath(TrainAI *this,World *world)

{
  PathCalculator *this_00;
  pointer ppIVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Player *pPVar8;
  IPost *pIVar9;
  undefined4 extraout_var;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *pvVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  HomeChecker *this_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  IPost *pIVar11;
  undefined4 extraout_var_05;
  Point *point;
  pointer ppIVar12;
  double dVar13;
  Point *local_68;
  double local_60;
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  local_48;
  undefined4 extraout_var_06;
  
  pPVar8 = trains::world::Train::getPlayer(this->train);
  pIVar9 = trains::world::Player::getHome(pPVar8);
  this_00 = &this->pathCalculator;
  iVar5 = (*pIVar9->_vptr_IPost[5])();
  iVar5 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var,iVar5));
  pvVar10 = trains::world::World::getPostList(world);
  ppIVar12 = (pvVar10->
             super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (pvVar10->
            super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar12 != ppIVar1) {
    local_60 = 0.0;
    local_68 = (Point *)0x0;
    do {
      pIVar11 = *ppIVar12;
      iVar6 = (*pIVar11->_vptr_IPost[7])(pIVar11);
      iVar7 = (uint)(this->type == ARMOR) * 3;
      if (this->type == PRODUCT) {
        iVar7 = 2;
      }
      if (iVar6 == iVar7) {
        iVar7 = (*pIVar11->_vptr_IPost[5])(pIVar11);
        iVar7 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var_00,iVar7));
        if (iVar7 != 0x7fffffff) {
          iVar7 = (*pIVar11->_vptr_IPost[5])(pIVar11);
          iVar6 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var_01,iVar7));
          iVar7 = (*pIVar9->_vptr_IPost[5])();
          iVar7 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var_02,iVar7));
          iVar7 = iVar7 + iVar6 * 2;
          this_01 = BotSharedData::getCheker(this->sharedData);
          bVar4 = HomeChecker::needHome(this_01,this->train,iVar7,iVar5,this->type);
          if (!bVar4) {
            iVar6 = (*pIVar11->_vptr_IPost[5])(pIVar11);
            iVar6 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var_03,iVar6));
            iVar6 = calculateProducts(this,iVar6,pIVar11);
            dVar13 = (double)iVar6 / (double)((iVar7 - iVar5) + 1);
            if (local_60 < dVar13) {
              iVar7 = (*pIVar11->_vptr_IPost[5])(pIVar11);
              local_68 = (Point *)CONCAT44(extraout_var_04,iVar7);
              local_60 = dVar13;
            }
          }
        }
      }
      ppIVar12 = ppIVar12 + 1;
    } while (ppIVar12 != ppIVar1);
    if (local_68 != (Point *)0x0) goto LAB_001507bd;
  }
  pPVar8 = trains::world::Train::getPlayer(this->train);
  pIVar11 = trains::world::Player::getHome(pPVar8);
  iVar5 = (*pIVar11->_vptr_IPost[5])(pIVar11);
  local_68 = (Point *)CONCAT44(extraout_var_05,iVar5);
LAB_001507bd:
  this->nextPoint = local_68;
  iVar5 = trains::world::Train::getGoods(this->train);
  iVar7 = trains::world::Train::getGoodsCapacity(this->train);
  if (iVar5 < iVar7) {
    point = this->nextPoint;
  }
  else {
    iVar5 = (*pIVar9->_vptr_IPost[5])();
    point = (Point *)CONCAT44(extraout_var_06,iVar5);
    this->nextPoint = point;
  }
  PathCalculator::getMinPath(&local_48,this_00,point);
  ppPVar2 = (this->currentPath).
            super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar3 = (this->currentPath).
            super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->currentPath).
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->currentPath).
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->currentPath).
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((ppPVar2 != (pointer)0x0) &&
     (operator_delete(ppPVar2,(long)ppPVar3 - (long)ppPVar2),
     local_48.
     super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_48.
                    super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TrainAI::makePath(const world::World &world)
{

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();


    int currHomeLen = pathCalculator.getMinLen(homeTown->getPoint());
    double maxProductByTick = 0;
    world::Point *tempNext = nullptr;
    int killer = 0;

    while(true)
    {
        for (auto post : world.getPostList())
        {
            if (post->getPostType() != getPostTypeByGood(type)
                    || pathCalculator.getMinLen(post->getPoint()) == INT_MAX
               )//  || train->getPoint() == post->getPoint())
                continue;

            int tempLen = pathCalculator.getMinLen(post->getPoint())*2
                          + pathCalculator.getMinLen(homeTown->getPoint()); // TODO DIJKSTRA for MARKET/TOWN

            if (sharedData->getCheker()->needHome(train,tempLen - killer, currHomeLen, type))
                continue;




            int predict =  calculateProducts(pathCalculator.getMinLen(post->getPoint()), post);

            if (((double)predict)/(tempLen-currHomeLen + 1) > maxProductByTick)
            {
                tempNext = post->getPoint();
                maxProductByTick = ((double)predict)/(tempLen-currHomeLen + 1);
            }

        }

//        if (lastPoint != homeTown->getPoint() || maxProductByTick > homeTown->getPopulation() -  killer)
        break;

//        killer++;
    }

    if (tempNext == nullptr)
        nextPoint = train->getPlayer()->getHome()->getPoint();
    else
        nextPoint = tempNext;


    if (train->getGoods() >= train->getGoodsCapacity())
        nextPoint = homeTown->getPoint();

    currentPath = pathCalculator.getMinPath(nextPoint);

}